

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-moments.cc
# Opt level: O2

void __thiscall
dynet::StdElements::forward_dev_impl<dynet::Device_CPU>
          (StdElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  Tensor *this_00;
  uint uVar2;
  uint uVar3;
  float *local_118;
  long local_110;
  DefaultDevice *local_108;
  float **local_100;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_f8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_e0;
  TensorCwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>_>_>
  local_c8;
  
  uVar2 = Dim::batch_size(&(*(xs->
                             super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                             )._M_impl.super__Vector_impl_data._M_start)->d);
  this_00 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
             ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (this_00->d).bd;
  uVar3 = Dim::batch_size(&this_00->d);
  Tensor::tbvec(&local_e0,
                *(xs->
                 super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start);
  Tensor::tbvec(&local_f8,
                *(xs->
                 super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start);
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
       local_e0.m_dimensions.super_array<long,_2>._M_elems[1];
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_lhs_xpr.m_data = local_e0.m_data;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
       local_e0.m_dimensions.super_array<long,_2>._M_elems[0];
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_expr.m_data = local_f8.m_data;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_expr.m_dimensions.
  super_array<long,_2>._M_elems[0] = local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_expr.m_dimensions.
  super_array<long,_2>._M_elems[1] = local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dims._M_elems[0] = (_Type)0;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[0] = 1;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_broadcast._M_elems[1] = 1;
  local_c8.m_xpr.m_xpr.m_dims._M_elems[0] = (_Type)0;
  local_118 = fx->v;
  local_110 = (long)(int)(fx->d).bd;
  local_100 = &local_118;
  local_108 = dev->edevice;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[1] = (ulong)uVar1;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_xpr.m_functor.m_value = (float)uVar3;
  local_c8.m_xpr.m_xpr.m_expr.m_xpr.m_rhs_xpr.m_broadcast._M_elems[0] = (ulong)uVar2;
  local_c8.m_xpr.m_functor.m_value = (float)uVar3;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
               *)&local_108,&local_c8);
  return;
}

Assistant:

void StdElements::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 1, "Failed dimension check in StdElements::forward");
  Eigen::array<ptrdiff_t, 1> red_axis = {0};
  Eigen::array<ptrdiff_t, 2> bcast = {xs[0]->d.batch_size(), 1};
  Eigen::array<ptrdiff_t, 2> newaxis = {1, xs[0]->d.bd};
  float n = (float) xs[0]->d.batch_size();
  fx.tb<0>().device(*dev.edevice) = ((xs[0]->tbvec() - (xs[0]->tbvec().sum(red_axis).reshape(newaxis) / n).broadcast(bcast)).square().sum(red_axis) / n).sqrt();
}